

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void hexdump(void *buf,int len)

{
  ulong uVar1;
  
  puts("\nHex dump");
  if (0 < len) {
    uVar1 = 0;
    do {
      printf("%02x",(ulong)*(byte *)((long)buf + uVar1));
      if ((uVar1 & 1) != 0) {
        putchar(0x20);
      }
      uVar1 = uVar1 + 1;
      if ((uVar1 & 0x1f) == 0) {
        putchar(10);
      }
    } while ((uint)len != uVar1);
  }
  putchar(10);
  return;
}

Assistant:

void hexdump(void *buf, int len)
{
        int n;
        unsigned char *p = buf;

        printf("\nHex dump\n");

        for (n = 0; n < len; n++) {
                printf("%02x", p[n]);

                if ((n + 1) % 2 == 0)
                        printf(" ");
                if ((n + 1) % 32 == 0)
                        printf("\n");
        }
        printf("\n");
}